

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_compress.c
# Opt level: O0

size_t libdeflate_gzip_compress
                 (libdeflate_compressor *c,void *in,size_t in_nbytes,void *out,
                 size_t out_nbytes_avail)

{
  uint uVar1;
  uint32_t uVar2;
  void *p;
  uint32_t *puVar3;
  undefined1 *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  libdeflate_compressor *in_RDI;
  ulong in_R8;
  size_t deflate_size;
  u8 xfl;
  uint compression_level;
  u8 *out_next;
  uint3 in_stack_ffffffffffffff60;
  u32 crc;
  uint32_t uVar4;
  libdeflate_compressor *in_stack_ffffffffffffff98;
  undefined1 *puVar5;
  
  if (in_R8 < 0x13) {
    puVar5 = (undefined1 *)0x0;
  }
  else {
    *in_RCX = 0x1f;
    in_RCX[1] = 0x8b;
    in_RCX[2] = 8;
    in_RCX[3] = 0;
    *(undefined4 *)(in_RCX + 4) = 0;
    crc = (u32)in_stack_ffffffffffffff60;
    puVar5 = in_RCX;
    uVar1 = libdeflate_get_compression_level(in_RDI);
    if (uVar1 < 2) {
      crc = crc | 0x4000000;
    }
    else if (7 < uVar1) {
      crc = crc | 0x2000000;
    }
    in_RCX[8] = (char)(crc >> 0x18);
    in_RCX[9] = 0xff;
    p = (void *)libdeflate_deflate_compress
                          (in_stack_ffffffffffffff98,in_RDI,in_RSI,in_RDX,(size_t)puVar5);
    uVar4 = (uint32_t)in_RDX;
    if (p == (void *)0x0) {
      puVar5 = (undefined1 *)0x0;
    }
    else {
      puVar3 = (uint32_t *)((long)p + (long)(in_RCX + 10));
      uVar2 = libdeflate_crc32(crc,p,0x122b35);
      *puVar3 = uVar2;
      puVar3[1] = uVar4;
      puVar5 = (undefined1 *)((long)puVar3 + (8 - (long)puVar5));
    }
  }
  return (size_t)puVar5;
}

Assistant:

LIBDEFLATEAPI size_t
libdeflate_gzip_compress(struct libdeflate_compressor *c,
			 const void *in, size_t in_nbytes,
			 void *out, size_t out_nbytes_avail)
{
	u8 *out_next = out;
	unsigned compression_level;
	u8 xfl;
	size_t deflate_size;

	if (out_nbytes_avail <= GZIP_MIN_OVERHEAD)
		return 0;

	/* ID1 */
	*out_next++ = GZIP_ID1;
	/* ID2 */
	*out_next++ = GZIP_ID2;
	/* CM */
	*out_next++ = GZIP_CM_DEFLATE;
	/* FLG */
	*out_next++ = 0;
	/* MTIME */
	put_unaligned_le32(GZIP_MTIME_UNAVAILABLE, out_next);
	out_next += 4;
	/* XFL */
	xfl = 0;
	compression_level = libdeflate_get_compression_level(c);
	if (compression_level < 2)
		xfl |= GZIP_XFL_FASTEST_COMPRESSION;
	else if (compression_level >= 8)
		xfl |= GZIP_XFL_SLOWEST_COMPRESSION;
	*out_next++ = xfl;
	/* OS */
	*out_next++ = GZIP_OS_UNKNOWN;	/* OS  */

	/* Compressed data  */
	deflate_size = libdeflate_deflate_compress(c, in, in_nbytes, out_next,
					out_nbytes_avail - GZIP_MIN_OVERHEAD);
	if (deflate_size == 0)
		return 0;
	out_next += deflate_size;

	/* CRC32 */
	put_unaligned_le32(libdeflate_crc32(0, in, in_nbytes), out_next);
	out_next += 4;

	/* ISIZE */
	put_unaligned_le32((u32)in_nbytes, out_next);
	out_next += 4;

	return out_next - (u8 *)out;
}